

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newpfor.h
# Opt level: O0

uint32_t __thiscall
FastPForLib::NewPFor<4U,_FastPForLib::Simple16<false>_>::findBestB
          (NewPFor<4U,_FastPForLib::Simple16<false>_> *this,uint32_t *in,uint32_t len)

{
  uint32_t uVar1;
  reference pvVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  size_type sVar3;
  uint in_EDX;
  uint32_t *in_RSI;
  uint32_t nExceptions;
  uint32_t i;
  uint32_t mb;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint32_t uVar4;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint uVar5;
  
  uVar1 = maxbits<unsigned_int_const*>
                    ((uint **)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (uint **)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  uVar5 = 0;
  while (uVar4 = uVar1,
        pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            NewPFor<4u,FastPForLib::Simple16<false>>::possLogs,(ulong)uVar5),
        *pvVar2 + 0x1c < uVar4) {
    uVar5 = uVar5 + 1;
  }
  while( true ) {
    this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar5;
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       NewPFor<4u,FastPForLib::Simple16<false>>::possLogs);
    if ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(sVar3 - 1) <= this_00) {
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back(this_00);
      return *pvVar2;
    }
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        NewPFor<4u,FastPForLib::Simple16<false>>::possLogs,(ulong)uVar5);
    uVar1 = tryB(*pvVar2,in_RSI,in_EDX);
    if (uVar1 * 10 <= in_EDX) break;
    uVar5 = uVar5 + 1;
  }
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      NewPFor<4u,FastPForLib::Simple16<false>>::possLogs,(ulong)uVar5);
  return *pvVar2;
}

Assistant:

__attribute__((pure)) uint32_t
NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::findBestB(
    const uint32_t *in, uint32_t len) {
  const uint32_t mb = maxbits(in, in + len);
  uint32_t i = 0;
  while (mb > 28 + possLogs[i])
    ++i; // some schemes such as Simple16 don't code numbers greater than 28

  for (; i < possLogs.size() - 1; i++) {

    const uint32_t nExceptions = tryB(possLogs[i], in, len);
    if (nExceptions * PFORDELTA_INVERSERATIO <= len)
      return possLogs[i];
  }
  return possLogs.back();
}